

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryMul<FadExpr<FadFuncCos<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>::dx
          (FadBinaryMul<FadExpr<FadFuncCos<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>
           *this,int i)

{
  double dVar1;
  double dVar2;
  FadExpr<FadFuncCos<Fad<double>_>_> *pFVar3;
  FadExpr<FadFuncSin<Fad<double>_>_> *pFVar4;
  double *pdVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  pFVar3 = this->left_;
  pdVar5 = &(pFVar3->fadexpr_).expr_.defaultVal;
  if ((pFVar3->fadexpr_).expr_.dx_.num_elts != 0) {
    pdVar5 = (pFVar3->fadexpr_).expr_.dx_.ptr_to_data + i;
  }
  dVar1 = *pdVar5;
  dVar6 = sin((pFVar3->fadexpr_).expr_.val_);
  dVar7 = sin((this->right_->fadexpr_).expr_.val_);
  pFVar4 = this->right_;
  pdVar5 = &(pFVar4->fadexpr_).expr_.defaultVal;
  if ((pFVar4->fadexpr_).expr_.dx_.num_elts != 0) {
    pdVar5 = (pFVar4->fadexpr_).expr_.dx_.ptr_to_data + i;
  }
  dVar2 = *pdVar5;
  dVar8 = cos((pFVar4->fadexpr_).expr_.val_);
  dVar9 = cos((this->left_->fadexpr_).expr_.val_);
  return dVar9 * dVar8 * dVar2 - dVar7 * dVar6 * dVar1;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) * right_.val() + right_.dx(i) * left_.val();}